

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O2

void __thiscall
soplex::SPxBasisBase<double>::loadBasisSolver
          (SPxBasisBase<double> *this,SLinSolver<double> *p_solver,bool destroy)

{
  undefined8 in_RAX;
  SPxOut *pSVar1;
  Verbosity old_verbosity;
  undefined8 local_28;
  
  pSVar1 = p_solver->spxout;
  this->spxout = pSVar1;
  local_28 = in_RAX;
  if ((pSVar1 != (SPxOut *)0x0) && (4 < (int)pSVar1->m_verbosity)) {
    local_28 = CONCAT44(pSVar1->m_verbosity,5);
    (*pSVar1->_vptr_SPxOut[2])();
    pSVar1 = soplex::operator<<(this->spxout,"IBASIS03 loading of Solver invalidates factorization")
    ;
    std::endl<char,std::char_traits<char>>(pSVar1->m_streams[pSVar1->m_verbosity]);
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,(long)&local_28 + 4);
  }
  if ((this->freeSlinSolver == true) && (this->factor != (SLinSolver<double> *)0x0)) {
    (*this->factor->_vptr_SLinSolver[0x1c])();
  }
  this->factor = p_solver;
  this->factorized = false;
  (*p_solver->_vptr_SLinSolver[2])(p_solver);
  this->freeSlinSolver = destroy;
  return;
}

Assistant:

void SPxBasisBase<R>::loadBasisSolver(SLinSolver<R>* p_solver, const bool destroy)
{
   assert(!freeSlinSolver || factor != nullptr);

   setOutstream(*p_solver->spxout);

   SPX_MSG_INFO3((*this->spxout),
                 (*this->spxout) << "IBASIS03 loading of Solver invalidates factorization"
                 << std::endl;)

   if(freeSlinSolver)
   {
      delete factor;
      factor = nullptr;
   }

   factor = p_solver;
   factorized = false;
   factor->clear();
   freeSlinSolver = destroy;
}